

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void ngai_do_elem2_oper(Integer atype,Integer cndim,Integer *loC,Integer *hiC,Integer *ldC,
                       void *A_ptr,void *B_ptr,void *C_ptr,int op)

{
  void *pA;
  long nelems;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  long in_R9;
  Integer unaff_retaddr;
  long in_stack_00000008;
  void *in_stack_00000010;
  Integer n1dim;
  Integer idx;
  void *tempC;
  void *tempB;
  void *tempA;
  Integer baseldC [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer j;
  Integer i;
  void *pC;
  void *pB;
  void *pA_00;
  long nelems_00;
  void *pC_00;
  void *pB_00;
  long alStack_e8 [3];
  Integer in_stack_ffffffffffffff30;
  Integer in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  void *pB_01;
  void *pA_01;
  long alStack_a8 [5];
  Integer in_stack_ffffffffffffff80;
  Integer nelems_01;
  void *pC_01;
  void *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  long local_40;
  long local_38;
  
  pC_00 = (void *)0x0;
  nelems_00 = 0;
  pA_00 = (void *)0x0;
  pC = (void *)0x1;
  for (local_38 = 1; local_38 < in_RSI; local_38 = local_38 + 1) {
    pC = (void *)(((*(long *)(in_RCX + local_38 * 8) - *(long *)(in_RDX + local_38 * 8)) + 1) *
                 (long)pC);
  }
  nelems_01 = 0;
  pC_01 = (void *)0x0;
  pB_01 = (void *)0x1;
  pA_01 = (void *)0x1;
  pB_00 = (void *)*in_R8;
  pA = (void *)((long)pB_00 * in_R8[1]);
  for (local_38 = 2; local_38 < in_RSI; local_38 = local_38 + 1) {
    *(undefined8 *)(&stack0xffffffffffffff88 + local_38 * 8) = 0;
    alStack_a8[local_38 + -2] =
         alStack_a8[local_38 + -3] *
         ((*(long *)(in_RCX + (local_38 + -1) * 8) - *(long *)(in_RDX + (local_38 + -1) * 8)) + 1);
    alStack_e8[local_38 + -2] = alStack_e8[local_38 + -3] * in_R8[local_38];
  }
  for (local_38 = 0; local_38 < (long)pC; local_38 = local_38 + 1) {
    pB = (void *)0x0;
    for (local_40 = 1; local_40 < in_RSI; local_40 = local_40 + 1) {
      pB = (void *)(*(long *)(&stack0xffffffffffffff88 + local_40 * 8) * alStack_e8[local_40 + -3] +
                   (long)pB);
      if ((local_38 + 1) % alStack_a8[local_40 + -2] == 0) {
        *(long *)(&stack0xffffffffffffff88 + local_40 * 8) =
             *(long *)(&stack0xffffffffffffff88 + local_40 * 8) + 1;
      }
      if (*(long *)(in_RCX + local_40 * 8) - *(long *)(in_RDX + local_40 * 8) <
          *(long *)(&stack0xffffffffffffff88 + local_40 * 8)) {
        *(undefined8 *)(&stack0xffffffffffffff88 + local_40 * 8) = 0;
      }
    }
    nelems = in_RDI + -0x3e9;
    switch(nelems) {
    case 0:
      pC_00 = (void *)(in_R9 + (long)pB * 4);
      nelems_00 = in_stack_00000008 + (long)pB * 4;
      pA_00 = (void *)((long)in_stack_00000010 + (long)pB * 4);
      break;
    case 1:
      pC_00 = (void *)(in_R9 + (long)pB * 8);
      nelems_00 = in_stack_00000008 + (long)pB * 8;
      pA_00 = (void *)((long)in_stack_00000010 + (long)pB * 8);
      break;
    case 2:
      pC_00 = (void *)(in_R9 + (long)pB * 4);
      nelems_00 = in_stack_00000008 + (long)pB * 4;
      pA_00 = (void *)((long)in_stack_00000010 + (long)pB * 4);
      break;
    case 3:
      pC_00 = (void *)(in_R9 + (long)pB * 8);
      nelems_00 = in_stack_00000008 + (long)pB * 8;
      pA_00 = (void *)((long)in_stack_00000010 + (long)pB * 8);
      break;
    default:
      pnga_error((char *)baseldC[6],baseldC[5]);
      break;
    case 5:
      pC_00 = (void *)(in_R9 + (long)pB * 8);
      nelems_00 = in_stack_00000008 + (long)pB * 8;
      pA_00 = (void *)((long)in_stack_00000010 + (long)pB * 8);
      break;
    case 6:
      pC_00 = (void *)(in_R9 + (long)pB * 0x10);
      nelems_00 = in_stack_00000008 + (long)pB * 0x10;
      pA_00 = (void *)((long)in_stack_00000010 + (long)pB * 0x10);
    }
    switch((ulong)((uint)n1dim - 3)) {
    case 0:
      do_multiply(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,pC_01,nelems_01,
                  in_stack_ffffffffffffff80);
      break;
    case 1:
      do_divide(pA_01,pB_01,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                in_stack_ffffffffffffff30);
      break;
    case 2:
      do_maximum((void *)idx,(void *)CONCAT44(n1dim._4_4_,(uint)n1dim),in_stack_00000010,
                 in_stack_00000008,unaff_retaddr);
      break;
    case 3:
      do_minimum((void *)idx,(void *)CONCAT44(n1dim._4_4_,(uint)n1dim),in_stack_00000010,
                 in_stack_00000008,unaff_retaddr);
      break;
    default:
      printf("op : OP_ELEM_MULT = %d:%d\n",(ulong)(uint)n1dim,3);
      pnga_error((char *)baseldC[6],baseldC[5]);
      break;
    case 6:
      do_step_divide(pA,pB_00,pC_00,nelems_00,(Integer)pA_00);
      break;
    case 7:
      do_stepb_divide(pA,pB_00,pC_00,nelems_00,(Integer)pA_00);
      break;
    case 8:
      do_step_mask(pA_00,pB,pC,nelems,(ulong)((uint)n1dim - 3));
    }
  }
  return;
}

Assistant:

static
void ngai_do_elem2_oper(Integer atype, Integer cndim, Integer *loC, Integer *hiC,
                        Integer *ldC, void *A_ptr, void *B_ptr, void *C_ptr, int op)
{
  Integer i, j;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  void *tempA = NULL, *tempB = NULL, *tempC = NULL;
  Integer idx, n1dim;
  /* compute "local" operation accoording to op */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<cndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<cndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }


  for(i=0; i<n1dim; i++) {
    idx = 0;
    for(j=1; j<cndim; j++) {
      idx += bvalue[j] * baseldC[j-1];
      if(((i+1) % bunit[j]) == 0) bvalue[j]++;
      if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
    }

    switch(atype){
      case C_DBL:
        tempA=((double*)A_ptr)+idx;
        tempB=((double*)B_ptr)+idx;
        tempC=((double*)C_ptr)+idx;
        break;
      case C_DCPL:
        tempA=((DoubleComplex*)A_ptr)+idx;
        tempB=((DoubleComplex*)B_ptr)+idx;
        tempC=((DoubleComplex*)C_ptr)+idx;
        break;
      case C_SCPL:
        tempA=((SingleComplex*)A_ptr)+idx;
        tempB=((SingleComplex*)B_ptr)+idx;
        tempC=((SingleComplex*)C_ptr)+idx;
        break;
      case C_INT:
        tempA=((int*)A_ptr)+idx;
        tempB=((int*)B_ptr)+idx;
        tempC=((int*)C_ptr)+idx;
        break;
      case C_FLOAT:
        tempA=((float*)A_ptr)+idx;
        tempB=((float*)B_ptr)+idx;
        tempC=((float*)C_ptr)+idx;
        break;
      case C_LONG:
        tempA=((long *)A_ptr)+idx;
        tempB=((long *)B_ptr)+idx;
        tempC=((long *)C_ptr)+idx;
        break;

      default: pnga_error(" wrong data type ",atype);
    }   
    switch((int)op)
    {
      case OP_ELEM_MULT:
        do_multiply(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_ELEM_DIV:
        do_divide(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_ELEM_SDIV:
        do_step_divide(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_ELEM_SDIV2:
        do_stepb_divide(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case OP_STEP_MASK:
        do_step_mask(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case  OP_ELEM_MAX:
        do_maximum(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      case  OP_ELEM_MIN:
        do_minimum(tempA,tempB,tempC,hiC[0]-loC[0]+1,atype);
        break;
      default: 
        printf("op : OP_ELEM_MULT = %d:%d\n", op, OP_ELEM_MULT);
        pnga_error(" wrong operation ",op);
    }
  }
}